

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Optional.h
# Opt level: O2

void __thiscall
llvm::optional_detail::OptionalStorage<std::function<void_(llbuild::basic::ProcessResult)>,_false>::
OptionalStorage(OptionalStorage<std::function<void_(llbuild::basic::ProcessResult)>,_false> *this,
               OptionalStorage<std::function<void_(llbuild::basic::ProcessResult)>,_false> *O)

{
  bool bVar1;
  function<void_(llbuild::basic::ProcessResult)> *__x;
  
  bVar1 = O->hasVal;
  this->hasVal = bVar1;
  if (bVar1 == true) {
    __x = getPointer(O);
    std::function<void_(llbuild::basic::ProcessResult)>::function
              ((function<void_(llbuild::basic::ProcessResult)> *)this,__x);
    return;
  }
  return;
}

Assistant:

OptionalStorage(const OptionalStorage &O) : hasVal(O.hasVal) {
    if (hasVal)
      new (storage.buffer) T(*O.getPointer());
  }